

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolor.cpp
# Opt level: O0

void __thiscall QColor::setHsl(QColor *this,int h,int s,int l,int a)

{
  ushort uVar1;
  uint in_ECX;
  uint in_EDX;
  int in_ESI;
  QColor *in_RDI;
  uint in_R8D;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_ESI < -1) || (0xff < in_EDX)) || (0xff < in_ECX)) || (0xff < in_R8D)) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_ECX,in_R8D),(char *)in_RDI,in_stack_ffffffffffffffb4,
               in_stack_ffffffffffffffa8);
    QMessageLogger::warning(local_28,"QColor::setHsl: HSL parameters out of range");
    invalidate(in_RDI);
  }
  else {
    in_RDI->cspec = Hsl;
    (in_RDI->ct).argb.alpha = (short)in_R8D * 0x101;
    if (in_ESI == -1) {
      uVar1 = 0xffff;
    }
    else {
      uVar1 = (short)(in_ESI % 0x168) * 100;
    }
    (in_RDI->ct).argb.red = uVar1;
    (in_RDI->ct).argb.green = (short)in_EDX * 0x101;
    (in_RDI->ct).argb.blue = (short)in_ECX * 0x101;
    (in_RDI->ct).argb.pad = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColor::setHsl(int h, int s, int l, int a)
{
    if (h < -1 || (uint)s > 255 || (uint)l > 255 || (uint)a > 255) {
        qWarning("QColor::setHsl: HSL parameters out of range");
        invalidate();
        return;
    }

    cspec = Hsl;
    ct.ahsl.alpha      = a * 0x101;
    ct.ahsl.hue        = h == -1 ? USHRT_MAX : (h % 360) * 100;
    ct.ahsl.saturation = s * 0x101;
    ct.ahsl.lightness  = l * 0x101;
    ct.ahsl.pad        = 0;
}